

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash_join_executor.cpp
# Opt level: O2

void __thiscall
duckdb::PerfectHashJoinExecutor::TemplatedFillSelectionVectorProbe<unsigned_long>
          (PerfectHashJoinExecutor *this,Vector *source,SelectionVector *build_sel_vec,
          SelectionVector *probe_sel_vec,idx_t count,idx_t *probe_sel_count)

{
  _Head_base<0UL,_bool_*,_false> _Var1;
  sel_t *psVar2;
  sel_t *psVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  idx_t iVar6;
  idx_t idx;
  ulong uVar7;
  idx_t i;
  ulong uVar8;
  idx_t iVar9;
  idx_t idx_1;
  long lVar10;
  idx_t iVar11;
  UnifiedVectorFormat vector_data;
  UnifiedVectorFormat local_78;
  
  uVar4 = Value::GetValueUnsafe<unsigned_long>(&(this->perfect_join_statistics).build_min);
  uVar5 = Value::GetValueUnsafe<unsigned_long>(&(this->perfect_join_statistics).build_max);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(source,count,&local_78);
  iVar6 = *probe_sel_count;
  _Var1._M_head_impl =
       (this->bitmap_build_idx).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  psVar2 = build_sel_vec->sel_vector;
  psVar3 = probe_sel_vec->sel_vector;
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    lVar10 = 0;
    for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
      iVar11 = iVar9;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        iVar11 = (idx_t)(local_78.sel)->sel_vector[iVar9];
      }
      uVar8 = *(ulong *)(local_78.data + iVar11 * 8);
      if ((uVar8 <= uVar5 && uVar4 <= uVar8) && (_Var1._M_head_impl[uVar8 - uVar4] == true)) {
        psVar2[lVar10] = (sel_t)(uVar8 - uVar4);
        psVar3[lVar10] = (sel_t)iVar9;
        lVar10 = lVar10 + 1;
        iVar6 = iVar6 + 1;
        *probe_sel_count = iVar6;
      }
    }
  }
  else {
    lVar10 = 0;
    for (uVar8 = 0; count != uVar8; uVar8 = uVar8 + 1) {
      uVar7 = uVar8;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar7 = (ulong)(local_78.sel)->sel_vector[uVar8];
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar7 >> 6] >>
           (uVar7 & 0x3f) & 1) != 0) {
        uVar7 = *(ulong *)(local_78.data + uVar7 * 8);
        if ((uVar7 <= uVar5 && uVar4 <= uVar7) && (_Var1._M_head_impl[uVar7 - uVar4] == true)) {
          psVar2[lVar10] = (sel_t)(uVar7 - uVar4);
          psVar3[lVar10] = (sel_t)uVar8;
          lVar10 = lVar10 + 1;
          iVar6 = iVar6 + 1;
          *probe_sel_count = iVar6;
        }
      }
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

void PerfectHashJoinExecutor::TemplatedFillSelectionVectorProbe(Vector &source, SelectionVector &build_sel_vec,
                                                                SelectionVector &probe_sel_vec, idx_t count,
                                                                idx_t &probe_sel_count) {
	auto min_value = perfect_join_statistics.build_min.GetValueUnsafe<T>();
	auto max_value = perfect_join_statistics.build_max.GetValueUnsafe<T>();

	UnifiedVectorFormat vector_data;
	source.ToUnifiedFormat(count, vector_data);
	auto data = reinterpret_cast<T *>(vector_data.data);
	auto validity_mask = &vector_data.validity;
	// build selection vector for non-dense build
	if (validity_mask->AllValid()) {
		for (idx_t i = 0, sel_idx = 0; i < count; ++i) {
			// retrieve value from vector
			auto data_idx = vector_data.sel->get_index(i);
			auto input_value = data[data_idx];
			// add index to selection vector if value in the range
			if (min_value <= input_value && input_value <= max_value) {
				auto idx = (idx_t)(input_value - min_value); // subtract min value to get the idx position
				                                             // check for matches in the build
				if (bitmap_build_idx[idx]) {
					build_sel_vec.set_index(sel_idx, idx);
					probe_sel_vec.set_index(sel_idx++, i);
					probe_sel_count++;
				}
			}
		}
	} else {
		for (idx_t i = 0, sel_idx = 0; i < count; ++i) {
			// retrieve value from vector
			auto data_idx = vector_data.sel->get_index(i);
			if (!validity_mask->RowIsValid(data_idx)) {
				continue;
			}
			auto input_value = data[data_idx];
			// add index to selection vector if value in the range
			if (min_value <= input_value && input_value <= max_value) {
				auto idx = (idx_t)(input_value - min_value); // subtract min value to get the idx position
				                                             // check for matches in the build
				if (bitmap_build_idx[idx]) {
					build_sel_vec.set_index(sel_idx, idx);
					probe_sel_vec.set_index(sel_idx++, i);
					probe_sel_count++;
				}
			}
		}
	}
}